

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasgridWrapper.cpp
# Opt level: O2

Data2D<double> *
readMatrixFromOpen<TasGrid::IO::mode_binary_type>
          (Data2D<double> *__return_storage_ptr__,istream *is)

{
  int iVar1;
  int iVar2;
  unsigned_long in_RCX;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  iVar1 = TasGrid::IO::readNumber<TasGrid::IO::mode_binary_type,int>(is);
  iVar2 = TasGrid::IO::readNumber<TasGrid::IO::mode_binary_type,int>(is);
  TasGrid::IO::readVector<TasGrid::IO::mode_binary_type,double,unsigned_long>
            ((vector<double,_std::allocator<double>_> *)&local_48,(IO *)is,
             (istream *)((long)iVar2 * (long)iVar1),in_RCX);
  __return_storage_ptr__->stride = (long)iVar2;
  __return_storage_ptr__->num_strips = (long)iVar1;
  (__return_storage_ptr__->vec).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = local_48._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->vec).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = local_48._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->vec).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_48._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  return __return_storage_ptr__;
}

Assistant:

Data2D<double> readMatrixFromOpen(std::istream &is){
    int rows = IO::readNumber<iomode, int>(is);
    int cols = IO::readNumber<iomode, int>(is);
    return Data2D<double>(cols, rows, IO::readVector<iomode, double>(is, Utils::size_mult(cols, rows)));
}